

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DependencyManager::AlterObject
          (DependencyManager *this,CatalogTransaction transaction,CatalogEntry *old_obj,
          CatalogEntry *new_obj,AlterInfo *alter_info)

{
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  CatalogTransaction transaction_02;
  CatalogTransaction transaction_03;
  DependencyInfo *pDVar1;
  bool bVar2;
  DependencyInfo *dep;
  DependencyInfo *info;
  vector<duckdb::DependencyInfo,_true> dependencies;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  dependency_set_t dependents;
  CatalogEntryInfo old_info;
  CatalogEntryInfo new_info;
  
  bVar2 = IsSystemEntry(this,new_obj);
  if (!bVar2) {
    GetLookupProperties(&old_info,old_obj);
    GetLookupProperties(&new_info,new_obj);
    dependencies.super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
    super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dependencies.super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
    super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dependencies.super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
    super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    dependents._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    dependents._M_h._M_element_count = 0;
    dependents._M_h._M_buckets = (__buckets_ptr)0x0;
    dependents._M_h._M_bucket_count = 0;
    dependents._M_h._M_buckets = (__buckets_ptr)operator_new(0x20);
    *dependents._M_h._M_buckets = (__node_base_ptr)alter_info;
    dependents._M_h._M_buckets[1] = (__node_base_ptr)old_obj;
    dependents._M_h._M_buckets[2] = (__node_base_ptr)&new_info;
    dependents._M_h._M_buckets[3] = (__node_base_ptr)&dependencies;
    dependents._M_h._M_element_count =
         (size_type)
         ::std::
         _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/catalog/dependency_manager.cpp:630:40)>
         ::_M_invoke;
    dependents._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/catalog/dependency_manager.cpp:630:40)>
         ::_M_manager;
    transaction_00.context.ptr = transaction.context.ptr;
    transaction_00.db.ptr = transaction.db.ptr;
    transaction_00.transaction.ptr = transaction.transaction.ptr;
    transaction_00.transaction_id = transaction.transaction_id;
    transaction_00.start_time = transaction.start_time;
    ScanSetInternal(this,transaction_00,&old_info,false,(dependency_callback_t *)&dependents);
    ::std::_Function_base::~_Function_base((_Function_base *)&dependents);
    dependents._M_h._M_buckets = &dependents._M_h._M_single_bucket;
    dependents._M_h._M_bucket_count = 1;
    dependents._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    dependents._M_h._M_element_count = 0;
    dependents._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    dependents._M_h._M_rehash_policy._M_next_resize = 0;
    dependents._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_108 = (code *)0x0;
    pcStack_100 = (code *)0x0;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_118._M_unused._M_object = operator_new(0x20);
    *(DependencyManager **)local_118._M_unused._0_8_ = this;
    *(CatalogTransaction **)((long)local_118._M_unused._0_8_ + 8) = &transaction;
    *(CatalogEntryInfo **)((long)local_118._M_unused._0_8_ + 0x10) = &new_info;
    *(vector<duckdb::DependencyInfo,_true> **)((long)local_118._M_unused._0_8_ + 0x18) =
         &dependencies;
    pcStack_100 = ::std::
                  _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/catalog/dependency_manager.cpp:675:38)>
                  ::_M_invoke;
    local_108 = ::std::
                _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/catalog/dependency_manager.cpp:675:38)>
                ::_M_manager;
    transaction_01.context.ptr = transaction.context.ptr;
    transaction_01.db.ptr = transaction.db.ptr;
    transaction_01.transaction.ptr = transaction.transaction.ptr;
    transaction_01.transaction_id = transaction.transaction_id;
    transaction_01.start_time = transaction.start_time;
    ScanSetInternal(this,transaction_01,&old_info,true,(dependency_callback_t *)&local_118);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_118);
    bVar2 = StringUtil::CIEquals((string *)&old_obj->name,(string *)&new_obj->name);
    info = dependencies.
           super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
           super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
    pDVar1 = dependencies.
             super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
             super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (!bVar2) {
      transaction_02.context.ptr = transaction.context.ptr;
      transaction_02.db.ptr = transaction.db.ptr;
      transaction_02.transaction.ptr = transaction.transaction.ptr;
      transaction_02.transaction_id = transaction.transaction_id;
      transaction_02.start_time = transaction.start_time;
      CleanupDependencies(this,transaction_02,old_obj);
      info = dependencies.
             super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
             super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
      pDVar1 = dependencies.
               super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
               super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    for (; info != pDVar1; info = info + 1) {
      transaction_03.context.ptr = transaction.context.ptr;
      transaction_03.db.ptr = transaction.db.ptr;
      transaction_03.transaction.ptr = transaction.transaction.ptr;
      transaction_03.transaction_id = transaction.transaction_id;
      transaction_03.start_time = transaction.start_time;
      CreateDependency(this,transaction_03,info);
    }
    ::std::
    _Hashtable<duckdb::Dependency,_duckdb::Dependency,_std::allocator<duckdb::Dependency>,_std::__detail::_Identity,_duckdb::DependencyEquality,_duckdb::DependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&dependents._M_h);
    ::std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>::~vector
              (&dependencies.
                super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>);
    CatalogEntryInfo::~CatalogEntryInfo(&new_info);
    CatalogEntryInfo::~CatalogEntryInfo(&old_info);
  }
  return;
}

Assistant:

void DependencyManager::AlterObject(CatalogTransaction transaction, CatalogEntry &old_obj, CatalogEntry &new_obj,
                                    AlterInfo &alter_info) {
	if (IsSystemEntry(new_obj)) {
		D_ASSERT(IsSystemEntry(old_obj));
		// Don't do anything for this
		return;
	}

	const auto old_info = GetLookupProperties(old_obj);
	const auto new_info = GetLookupProperties(new_obj);

	vector<DependencyInfo> dependencies;
	// Other entries that depend on us
	ScanDependents(transaction, old_info, [&](DependencyEntry &dep) {
		// It makes no sense to have a schema depend on anything
		D_ASSERT(dep.EntryInfo().type != CatalogType::SCHEMA_ENTRY);

		bool disallow_alter = true;
		switch (alter_info.type) {
		case AlterType::ALTER_TABLE: {
			auto &alter_table = alter_info.Cast<AlterTableInfo>();
			switch (alter_table.alter_table_type) {
			case AlterTableType::FOREIGN_KEY_CONSTRAINT: {
				// These alters are made as part of a CREATE or DROP table statement when a foreign key column is
				// present either adding or removing a reference to the referenced primary key table
				disallow_alter = false;
				break;
			}
			case AlterTableType::ADD_COLUMN: {
				disallow_alter = false;
				break;
			}
			default:
				break;
			}
			break;
		}
		case AlterType::SET_COLUMN_COMMENT:
		case AlterType::SET_COMMENT: {
			disallow_alter = false;
			break;
		}
		default:
			break;
		}
		if (disallow_alter) {
			throw DependencyException("Cannot alter entry \"%s\" because there are entries that "
			                          "depend on it.",
			                          old_obj.name);
		}

		auto dep_info = DependencyInfo::FromDependent(dep);
		dep_info.subject.entry = new_info;
		dependencies.emplace_back(dep_info);
	});

	// Keep old dependencies
	dependency_set_t dependents;
	ScanSubjects(transaction, old_info, [&](DependencyEntry &dep) {
		auto entry = LookupEntry(transaction, dep);
		if (!entry) {
			return;
		}

		auto dep_info = DependencyInfo::FromSubject(dep);
		dep_info.dependent.entry = new_info;
		dependencies.emplace_back(dep_info);
	});

	// FIXME: we should update dependencies in the future
	// some alters could cause dependencies to change (imagine types of table columns)
	// or DEFAULT depending on a sequence
	if (!StringUtil::CIEquals(old_obj.name, new_obj.name)) {
		// The name has been changed, we need to recreate the dependency links
		CleanupDependencies(transaction, old_obj);
	}

	// Reinstate the old dependencies
	for (auto &dep : dependencies) {
		CreateDependency(transaction, dep);
	}
}